

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckBlockSignature
          (SharedValidator *this,Location *loc,Opcode opcode,Type sig_type,
          TypeVector *out_param_types,TypeVector *out_result_types)

{
  pointer pTVar1;
  pointer pTVar2;
  TypeVector *this_00;
  Result RVar3;
  Result RVar4;
  Enum EVar5;
  bool bVar6;
  FuncType func_type;
  Opcode local_124;
  TypeVector *local_120;
  Location *local_118;
  Type local_110;
  FuncType local_108;
  Info local_c8;
  Var local_78;
  
  local_124.enum_ = opcode.enum_;
  local_110 = sig_type;
  if (sig_type.enum_ < Any) {
    pTVar1 = (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    Type::GetInlineVector((TypeVector *)&local_c8,&local_110);
    pTVar1 = (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pTVar2 = (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_c8.name;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_c8.decomp;
    (out_result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_c8.result_type;
    local_c8.name = (char *)0x0;
    local_c8.decomp = (char *)0x0;
    local_c8.result_type.enum_ = Any;
    local_c8.result_type.type_index_ = 0;
    if ((pTVar1 != (pointer)0x0) &&
       (operator_delete(pTVar1,(long)pTVar2 - (long)pTVar1), local_c8.name != (char *)0x0)) {
      operator_delete(local_c8.name,(long)local_c8.result_type - (long)local_c8.name);
    }
    EVar5 = Ok;
  }
  else {
    local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120 = out_param_types;
    local_118 = loc;
    Var::Var(&local_78,sig_type.enum_,loc);
    RVar3 = CheckFuncTypeIndex(this,&local_78,&local_108);
    bVar6 = RVar3.enum_ == Error;
    Var::~Var(&local_78);
    this_00 = local_120;
    if ((local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((this->options_).features.multi_value_enabled_ == false)) {
      Opcode::GetInfo(&local_c8,&local_124);
      RVar4 = PrintError(this,local_118,"%s params not currently supported.",local_c8.name);
      bVar6 = RVar4.enum_ == Error || RVar3.enum_ == Error;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(this_00,&local_108.params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_result_types,&local_108.results);
    if (local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    EVar5 = (Enum)bVar6;
  }
  return (Result)EVar5;
}

Assistant:

Result SharedValidator::CheckBlockSignature(const Location& loc,
                                            Opcode opcode,
                                            Type sig_type,
                                            TypeVector* out_param_types,
                                            TypeVector* out_result_types) {
  Result result = Result::Ok;

  if (sig_type.IsIndex()) {
    Index sig_index = sig_type.GetIndex();
    FuncType func_type;
    result |= CheckFuncTypeIndex(Var(sig_index, loc), &func_type);

    if (!func_type.params.empty() && !options_.features.multi_value_enabled()) {
      result |= PrintError(loc, "%s params not currently supported.",
                           opcode.GetName());
    }
    // Multiple results without --enable-multi-value is checked above in
    // OnType.

    *out_param_types = func_type.params;
    *out_result_types = func_type.results;
  } else {
    out_param_types->clear();
    *out_result_types = sig_type.GetInlineVector();
  }

  return result;
}